

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O0

void __thiscall
slang::ast::NewCovergroupExpression::visitExprs<slang::ast::NetAliasVisitor&>
          (NewCovergroupExpression *this,NetAliasVisitor *visitor)

{
  bool bVar1;
  reference ppEVar2;
  long in_RDI;
  Expression *arg;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range3;
  NetAliasVisitor *in_stack_ffffffffffffffc8;
  Expression *in_stack_ffffffffffffffd0;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffffd8;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_20;
  long local_18;
  
  local_18 = in_RDI + 0x30;
  local_20._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffffc8);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
            (in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*(&local_20);
    in_stack_ffffffffffffffd0 = *ppEVar2;
    Expression::visit<slang::ast::NetAliasVisitor&>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto arg : arguments)
            arg->visit(visitor);
    }